

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::inner_loop<false>
               (single_learner *base,example *ec,uint32_t i,float cost,uint32_t *prediction,
               float *score,float *partial_prediction)

{
  float fVar1;
  float x;
  
  LEARNER::learner<char,_example>::predict(base,ec,(ulong)(i - 1));
  x = ec->partial_prediction;
  *partial_prediction = x;
  fVar1 = *score;
  if ((x < fVar1) || (((x == fVar1 && (!NAN(x) && !NAN(fVar1))) && (i < *prediction)))) {
    *score = x;
    *prediction = i;
    x = ec->partial_prediction;
  }
  add_passthrough_feature_magic(ec,0x398d4541,(ulong)i,x);
  return;
}

Assistant:

inline void inner_loop(single_learner& base, example& ec, uint32_t i, float cost, uint32_t& prediction, float& score,
    float& partial_prediction)
{
  if (is_learn)
  {
    ec.weight = (cost == FLT_MAX) ? 0.f : 1.f;
    ec.l.simple.label = cost;
    base.learn(ec, i - 1);
  }
  else
    base.predict(ec, i - 1);

  partial_prediction = ec.partial_prediction;
  if (ec.partial_prediction < score || (ec.partial_prediction == score && i < prediction))
  {
    score = ec.partial_prediction;
    prediction = i;
  }
  add_passthrough_feature(ec, i, ec.partial_prediction);
}